

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_annotation.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_4::ValidateDecorationTarget
          (ValidationState_t *_,Decoration dec,Instruction *inst,Instruction *target)

{
  bool bVar1;
  int32_t iVar2;
  BuiltIn BVar3;
  Op OVar4;
  uint32_t uVar5;
  spv_result_t sVar6;
  spv_const_context psVar7;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this;
  size_type sVar8;
  DiagnosticStream *pDVar9;
  DiagnosticStream local_1c48;
  DiagnosticStream local_1a70;
  DiagnosticStream local_1898;
  DiagnosticStream local_16c0;
  DiagnosticStream local_14e8;
  string local_1310;
  string local_12f0;
  DiagnosticStream local_12d0;
  Instruction *local_10f8;
  Instruction *type;
  undefined1 local_10e8 [4];
  StorageClass sc;
  DiagnosticStream local_f10;
  DiagnosticStream local_d38;
  DiagnosticStream local_b60;
  DiagnosticStream local_988;
  DiagnosticStream local_7b0;
  DiagnosticStream local_5d8;
  DiagnosticStream local_400;
  DiagnosticStream local_228;
  undefined1 local_50 [8];
  anon_class_32_4_2877ff2f fail;
  Instruction *target_local;
  Instruction *inst_local;
  Decoration dec_local;
  ValidationState_t *__local;
  
  local_50 = (undefined1  [8])_;
  fail._._0_4_ = dec;
  fail._8_8_ = inst;
  fail.inst = target;
  fail.target = target;
  if (dec == DecorationSpecId) {
    OVar4 = val::Instruction::opcode(target);
    bVar1 = spvOpcodeIsScalarSpecConstant(OVar4);
    if (!bVar1) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                (&local_228,(anon_class_32_4_2877ff2f *)local_50,0);
      pDVar9 = DiagnosticStream::operator<<
                         (&local_228,(char (*) [41])"must be a scalar specialization constant");
      sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      DiagnosticStream::~DiagnosticStream(&local_228);
      return sVar6;
    }
    goto LAB_00b06303;
  }
  if (1 < dec - Block) {
    if (dec == ArrayStride) {
      OVar4 = val::Instruction::opcode(target);
      if ((((OVar4 != OpTypeArray) &&
           (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpTypeRuntimeArray)) &&
          (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpTypePointer)) &&
         (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpTypeUntypedPointerKHR)) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_5d8,(anon_class_32_4_2877ff2f *)local_50,0);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_5d8,(char (*) [33])"must be an array or pointer type");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_5d8);
        return sVar6;
      }
      goto LAB_00b06303;
    }
    if (2 < dec - DecorationGLSLShared) {
      if (dec == BuiltIn) {
        OVar4 = val::Instruction::opcode(target);
        if ((OVar4 != OpVariable) &&
           (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpUntypedVariableKHR)) {
          OVar4 = val::Instruction::opcode(fail.target);
          iVar2 = spvOpcodeIsConstant(OVar4);
          if (iVar2 == 0) {
            ValidationState_t::diag(&local_7b0,_,SPV_ERROR_INVALID_DATA,inst);
            pDVar9 = DiagnosticStream::operator<<
                               (&local_7b0,
                                (char (*) [67])
                                "BuiltIns can only target variables, structure members or constants"
                               );
            sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_7b0);
            return sVar6;
          }
        }
        bVar1 = ValidationState_t::HasCapability(_,CapabilityShader);
        if ((bVar1) &&
           (BVar3 = val::Instruction::GetOperandAs<spv::BuiltIn>(inst,2),
           BVar3 == BuiltInWorkgroupSize)) {
          OVar4 = val::Instruction::opcode(fail.target);
          iVar2 = spvOpcodeIsConstant(OVar4);
          if (iVar2 == 0) {
            ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                      (&local_988,(anon_class_32_4_2877ff2f *)local_50,0);
            pDVar9 = DiagnosticStream::operator<<
                               (&local_988,(char (*) [37])"must be a constant for WorkgroupSize");
            sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_988);
            return sVar6;
          }
        }
        else {
          OVar4 = val::Instruction::opcode(fail.target);
          if ((OVar4 != OpVariable) &&
             (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpUntypedVariableKHR)) {
            ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                      (&local_b60,(anon_class_32_4_2877ff2f *)local_50,0);
            pDVar9 = DiagnosticStream::operator<<(&local_b60,(char (*) [19])"must be a variable");
            sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream(&local_b60);
            return sVar6;
          }
        }
        goto LAB_00b06303;
      }
      if (4 < dec - DecorationNoPerspective) {
        if (dec == DecorationInvariant) {
LAB_00b062a0:
          OVar4 = val::Instruction::opcode(target);
          if ((OVar4 != OpVariable) &&
             (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpUntypedVariableKHR)) {
            ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                      ((DiagnosticStream *)local_10e8,(anon_class_32_4_2877ff2f *)local_50,0);
            pDVar9 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)local_10e8,(char (*) [19])"must be a variable");
            sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_10e8);
            return sVar6;
          }
          goto LAB_00b06303;
        }
        if (2 < dec - DecorationRestrict) {
          if (dec == Constant) goto LAB_00b062a0;
          if ((2 < dec - Coherent) && (dec != DecorationStream)) {
            if (dec == DecorationLocation) goto LAB_00b062a0;
            if (dec != Component) {
              if (dec - DecorationIndex < 3) goto LAB_00b062a0;
              if (1 < dec - DecorationXfbBuffer) {
                if (dec == DecorationInputAttachmentIndex) goto LAB_00b062a0;
                if ((dec != DecorationPerPrimitiveEXT) && (1 < dec - DecorationRestrictPointer))
                goto LAB_00b06303;
              }
            }
          }
        }
      }
      OVar4 = val::Instruction::opcode(target);
      if ((OVar4 != OpVariable) &&
         (((OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpUntypedVariableKHR &&
           (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpFunctionParameter)) &&
          (OVar4 = val::Instruction::opcode(fail.target), OVar4 != OpRawAccessChainNV)))) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_d38,(anon_class_32_4_2877ff2f *)local_50,0);
        pDVar9 = DiagnosticStream::operator<<(&local_d38,(char (*) [36])0xd2ce11);
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_d38);
        return sVar6;
      }
      uVar5 = val::Instruction::type_id(fail.target);
      bVar1 = ValidationState_t::IsPointerType(_,uVar5);
      if (!bVar1) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_f10,(anon_class_32_4_2877ff2f *)local_50,0);
        pDVar9 = DiagnosticStream::operator<<(&local_f10,(char (*) [23])"must be a pointer type");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_f10);
        return sVar6;
      }
      goto LAB_00b06303;
    }
  }
  OVar4 = val::Instruction::opcode(target);
  if (OVar4 != OpTypeStruct) {
    ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
              (&local_400,(anon_class_32_4_2877ff2f *)local_50,0);
    pDVar9 = DiagnosticStream::operator<<(&local_400,(char (*) [25])"must be a structure type");
    sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
    DiagnosticStream::~DiagnosticStream(&local_400);
    return sVar6;
  }
LAB_00b06303:
  psVar7 = ValidationState_t::context(_);
  bVar1 = spvIsVulkanEnv(psVar7->target_env);
  if (bVar1) {
    type._4_4_ = StorageClassUniform;
    uVar5 = val::Instruction::type_id(fail.target);
    local_10f8 = ValidationState_t::FindDef(_,uVar5);
    if (local_10f8 != (Instruction *)0x0) {
      this = val::Instruction::operands(local_10f8);
      sVar8 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this);
      if (2 < sVar8) {
        type._4_4_ = val::Instruction::GetOperandAs<spv::StorageClass>(local_10f8,1);
      }
    }
    if ((dec - DecorationNoPerspective < 2) || (dec - Centroid < 2)) {
      if ((type._4_4_ != Input) && (type._4_4_ != Output)) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_1a70,(anon_class_32_4_2877ff2f *)local_50,0x123e);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_1a70,(char (*) [38])"storage class must be Input or Output");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_1a70);
        return sVar6;
      }
    }
    else if (dec - DecorationLocation < 2) {
      if ((((((type._4_4_ != Input) && (type._4_4_ != Output)) && (type._4_4_ != RayPayloadKHR)) &&
           ((type._4_4_ != IncomingRayPayloadKHR && (type._4_4_ != HitAttributeKHR)))) &&
          (((type._4_4_ != CallableDataKHR &&
            ((type._4_4_ != IncomingCallableDataKHR && (type._4_4_ != ShaderRecordBufferKHR)))) &&
           (type._4_4_ != HitObjectAttributeNV)))) && (type._4_4_ != StorageClassTileImageEXT)) {
        ValidationState_t::diag(&local_12d0,_,SPV_ERROR_INVALID_ID,fail.target);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_12f0,_,0x1a10,(char *)0x0);
        pDVar9 = DiagnosticStream::operator<<(&local_12d0,&local_12f0);
        ValidationState_t::SpvDecorationString_abi_cxx11_(&local_1310,_,dec);
        pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_1310);
        pDVar9 = DiagnosticStream::operator<<
                           (pDVar9,(char (*) [54])
                                   " decoration must not be applied to this storage class");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        std::__cxx11::string::~string((string *)&local_1310);
        std::__cxx11::string::~string((string *)&local_12f0);
        DiagnosticStream::~DiagnosticStream(&local_12d0);
        return sVar6;
      }
    }
    else if (dec == DecorationIndex) {
      if (type._4_4_ != Output) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_14e8,(anon_class_32_4_2877ff2f *)local_50,0);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_14e8,(char (*) [36])"must be in the Output storage class");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_14e8);
        return sVar6;
      }
    }
    else if (dec - Binding < 2) {
      if (((type._4_4_ != StorageBuffer) && (type._4_4_ != StorageClassUniform)) &&
         (type._4_4_ != StorageClassUniformConstant)) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_16c0,(anon_class_32_4_2877ff2f *)local_50,0x195b);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_16c0,
                            (char (*) [72])
                            "must be in the StorageBuffer, Uniform, or UniformConstant storage class"
                           );
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_16c0);
        return sVar6;
      }
    }
    else if (dec == DecorationInputAttachmentIndex) {
      if (type._4_4_ != StorageClassUniformConstant) {
        ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                  (&local_1898,(anon_class_32_4_2877ff2f *)local_50,0x1a16);
        pDVar9 = DiagnosticStream::operator<<
                           (&local_1898,
                            (char (*) [45])"must be in the UniformConstant storage class");
        sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
        DiagnosticStream::~DiagnosticStream(&local_1898);
        return sVar6;
      }
    }
    else if ((dec == DecorationPerVertexKHR) && (type._4_4_ != Input)) {
      ValidateDecorationTarget::anon_class_32_4_2877ff2f::operator()
                (&local_1c48,(anon_class_32_4_2877ff2f *)local_50,0x1a79);
      pDVar9 = DiagnosticStream::operator<<
                         (&local_1c48,(char (*) [28])"storage class must be Input");
      sVar6 = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
      DiagnosticStream::~DiagnosticStream(&local_1c48);
      return sVar6;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateDecorationTarget(ValidationState_t& _, spv::Decoration dec,
                                      const Instruction* inst,
                                      const Instruction* target) {
  auto fail = [&_, dec, inst, target](uint32_t vuid) -> DiagnosticStream {
    DiagnosticStream ds = std::move(
        _.diag(SPV_ERROR_INVALID_ID, inst)
        << _.VkErrorID(vuid) << _.SpvDecorationString(dec)
        << " decoration on target <id> " << _.getIdName(target->id()) << " ");
    return ds;
  };
  switch (dec) {
    case spv::Decoration::SpecId:
      if (!spvOpcodeIsScalarSpecConstant(target->opcode())) {
        return fail(0) << "must be a scalar specialization constant";
      }
      break;
    case spv::Decoration::Block:
    case spv::Decoration::BufferBlock:
    case spv::Decoration::GLSLShared:
    case spv::Decoration::GLSLPacked:
    case spv::Decoration::CPacked:
      if (target->opcode() != spv::Op::OpTypeStruct) {
        return fail(0) << "must be a structure type";
      }
      break;
    case spv::Decoration::ArrayStride:
      if (target->opcode() != spv::Op::OpTypeArray &&
          target->opcode() != spv::Op::OpTypeRuntimeArray &&
          target->opcode() != spv::Op::OpTypePointer &&
          target->opcode() != spv::Op::OpTypeUntypedPointerKHR) {
        return fail(0) << "must be an array or pointer type";
      }
      break;
    case spv::Decoration::BuiltIn:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR &&
          !spvOpcodeIsConstant(target->opcode())) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "BuiltIns can only target variables, structure members or "
                  "constants";
      }
      if (_.HasCapability(spv::Capability::Shader) &&
          inst->GetOperandAs<spv::BuiltIn>(2) == spv::BuiltIn::WorkgroupSize) {
        if (!spvOpcodeIsConstant(target->opcode())) {
          return fail(0) << "must be a constant for WorkgroupSize";
        }
      } else if (target->opcode() != spv::Op::OpVariable &&
                 target->opcode() != spv::Op::OpUntypedVariableKHR) {
        return fail(0) << "must be a variable";
      }
      break;
    case spv::Decoration::NoPerspective:
    case spv::Decoration::Flat:
    case spv::Decoration::Patch:
    case spv::Decoration::Centroid:
    case spv::Decoration::Sample:
    case spv::Decoration::Restrict:
    case spv::Decoration::Aliased:
    case spv::Decoration::Volatile:
    case spv::Decoration::Coherent:
    case spv::Decoration::NonWritable:
    case spv::Decoration::NonReadable:
    case spv::Decoration::XfbBuffer:
    case spv::Decoration::XfbStride:
    case spv::Decoration::Component:
    case spv::Decoration::Stream:
    case spv::Decoration::RestrictPointer:
    case spv::Decoration::AliasedPointer:
    case spv::Decoration::PerPrimitiveEXT:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR &&
          target->opcode() != spv::Op::OpFunctionParameter &&
          target->opcode() != spv::Op::OpRawAccessChainNV) {
        return fail(0) << "must be a memory object declaration";
      }
      if (!_.IsPointerType(target->type_id())) {
        return fail(0) << "must be a pointer type";
      }
      break;
    case spv::Decoration::Invariant:
    case spv::Decoration::Constant:
    case spv::Decoration::Location:
    case spv::Decoration::Index:
    case spv::Decoration::Binding:
    case spv::Decoration::DescriptorSet:
    case spv::Decoration::InputAttachmentIndex:
      if (target->opcode() != spv::Op::OpVariable &&
          target->opcode() != spv::Op::OpUntypedVariableKHR) {
        return fail(0) << "must be a variable";
      }
      break;
    default:
      break;
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    // The following were all checked as pointer types above.
    spv::StorageClass sc = spv::StorageClass::Uniform;
    const auto type = _.FindDef(target->type_id());
    if (type && type->operands().size() > 2) {
      sc = type->GetOperandAs<spv::StorageClass>(1);
    }
    switch (dec) {
      case spv::Decoration::Location:
      case spv::Decoration::Component:
        // Location is used for input, output, tile image, and ray tracing
        // stages.
        if (sc != spv::StorageClass::Input && sc != spv::StorageClass::Output &&
            sc != spv::StorageClass::RayPayloadKHR &&
            sc != spv::StorageClass::IncomingRayPayloadKHR &&
            sc != spv::StorageClass::HitAttributeKHR &&
            sc != spv::StorageClass::CallableDataKHR &&
            sc != spv::StorageClass::IncomingCallableDataKHR &&
            sc != spv::StorageClass::ShaderRecordBufferKHR &&
            sc != spv::StorageClass::HitObjectAttributeNV &&
            sc != spv::StorageClass::TileImageEXT) {
          return _.diag(SPV_ERROR_INVALID_ID, target)
                 << _.VkErrorID(6672) << _.SpvDecorationString(dec)
                 << " decoration must not be applied to this storage class";
        }
        break;
      case spv::Decoration::Index:
        // Langauge from SPIR-V definition of Index
        if (sc != spv::StorageClass::Output) {
          return fail(0) << "must be in the Output storage class";
        }
        break;
      case spv::Decoration::Binding:
      case spv::Decoration::DescriptorSet:
        if (sc != spv::StorageClass::StorageBuffer &&
            sc != spv::StorageClass::Uniform &&
            sc != spv::StorageClass::UniformConstant) {
          return fail(6491) << "must be in the StorageBuffer, Uniform, or "
                               "UniformConstant storage class";
        }
        break;
      case spv::Decoration::InputAttachmentIndex:
        if (sc != spv::StorageClass::UniformConstant) {
          return fail(6678) << "must be in the UniformConstant storage class";
        }
        break;
      case spv::Decoration::Flat:
      case spv::Decoration::NoPerspective:
      case spv::Decoration::Centroid:
      case spv::Decoration::Sample:
        if (sc != spv::StorageClass::Input && sc != spv::StorageClass::Output) {
          return fail(4670) << "storage class must be Input or Output";
        }
        break;
      case spv::Decoration::PerVertexKHR:
        if (sc != spv::StorageClass::Input) {
          return fail(6777) << "storage class must be Input";
        }
        break;
      default:
        break;
    }
  }
  return SPV_SUCCESS;
}